

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_extended_test.cc
# Opt level: O1

void test_multi_readers(multi_reader_type reader_type,char *test_name)

{
  pointer ppfVar1;
  multi_reader_type mVar2;
  fdb_status fVar3;
  undefined8 extraout_RAX;
  int in_ECX;
  code *__start_routine;
  pthread_t *__newthread;
  ulong uVar4;
  int *piVar5;
  undefined1 *puVar6;
  char *__format;
  long lVar7;
  int iVar8;
  int local_218 [2];
  long alStack_210 [4];
  undefined4 auStack_1f0 [14];
  void *local_1b8 [2];
  pthread_t local_1a8 [2];
  undefined1 local_198 [8];
  fdb_config fconfig;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  undefined1 auStack_68 [8];
  vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> docs;
  fdb_file_handle *local_48;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  
  piVar5 = (int *)local_198;
  puVar6 = local_198;
  local_1a8[1] = 0x105a44;
  db._4_4_ = reader_type;
  gettimeofday((timeval *)&fconfig.num_blocks_readahead,(__timezone_ptr_t)0x0);
  local_1a8[1] = 0x105a49;
  memleak_start();
  local_1a8[1] = 0x105a55;
  system("rm -rf  test.fdb* > errorlog.txt");
  local_1a8[1] = 0x105a64;
  fdb_get_default_config();
  fconfig.wal_flush_before_commit = true;
  fconfig.num_bgflusher_threads._0_4_ = cur_encryption;
  local_1a8[1] = 0x105a87;
  _set_random_string((char *)((long)&fconfig.num_bgflusher_threads + 4),0x20);
  local_1a8[1] = 0x105a93;
  fdb_get_default_kvs_config();
  local_1a8[1] = 0x105aa6;
  fVar3 = fdb_open(&local_48,test_filename,(fdb_config *)local_198);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    local_1a8[1] = 0x105ac2;
    fVar3 = fdb_kvs_open_default
                      (local_48,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)&__test_begin.tv_usec);
    piVar5 = (int *)local_198;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      local_1a8[1] = 0x105ae5;
      fVar3 = fdb_set_log_callback((fdb_kvs_handle *)dbfile,logCallbackFunc,"multi_reader_thread");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00105cb1;
      auStack_68 = (undefined1  [8])0x0;
      docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8[1] = 0x105b0a;
      auStack_68 = (undefined1  [8])operator_new(800000);
      ppfVar1 = (pointer)((long)auStack_68 + 800000);
      local_1a8[1] = 0x105b2b;
      docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)auStack_68;
      docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppfVar1;
      memset((void *)auStack_68,0,800000);
      local_1a8[1] = 0x105b3f;
      docs.super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppfVar1;
      loadDocsWithRandomKeys
                (local_48,(fdb_kvs_handle *)dbfile,
                 (vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *)auStack_68,in_ECX);
      local_1a8[1] = 0x105b48;
      fdb_kvs_close((fdb_kvs_handle *)dbfile);
      local_1a8[1] = 0x105b51;
      fdb_close(local_48);
      piVar5 = local_218;
      iVar8 = 0;
      lVar7 = 0;
      __newthread = local_1a8;
      do {
        mVar2 = db._4_4_;
        *(int *)((long)piVar5 + lVar7) = iVar8;
        *(undefined8 *)((long)alStack_210 + lVar7) = 100000;
        *(undefined1 **)((long)alStack_210 + lVar7 + 8) = auStack_68;
        *(undefined1 **)((long)alStack_210 + lVar7 + 0x10) = local_198;
        *(__suseconds_t **)((long)alStack_210 + lVar7 + 0x18) = &__test_begin.tv_usec;
        *(undefined4 *)((long)auStack_1f0 + lVar7) = 1;
        if ((mVar2 == MULTI_SNAPSHOT_READERS) || ((mVar2 != MULTI_READERS && (lVar7 == 0)))) {
          __start_routine = _snapshot_reader_thread;
        }
        else {
          __start_routine = _reader_thread;
        }
        pthread_create(__newthread,(pthread_attr_t *)0x0,__start_routine,
                       (undefined1 *)((long)piVar5 + lVar7));
        lVar7 = lVar7 + 0x30;
        __newthread = __newthread + 1;
        iVar8 = iVar8 + 1;
      } while (lVar7 == 0x30);
      lVar7 = 0;
      do {
        pthread_join(*(pthread_t *)((long)local_1a8 + lVar7),(void **)((long)local_1b8 + lVar7));
        lVar7 = lVar7 + 8;
      } while (lVar7 == 8);
      uVar4 = 0;
      while( true ) {
        if ((ulong)((long)docs.
                          super__Vector_base<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_>.
                          _M_impl.super__Vector_impl_data._M_start - (long)auStack_68 >> 3) <= uVar4
           ) break;
        fdb_doc_free(*(pointer)((long)auStack_68 + uVar4 * 8));
        uVar4 = uVar4 + 1;
        if (uVar4 == 100000) {
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (test_multi_readers(multi_reader_type,char_const*)::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,test_name);
          if (auStack_68 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_68);
          }
          return;
        }
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
      goto LAB_00105ca7;
    }
  }
  else {
LAB_00105ca7:
    piVar5[-2] = 0x105cac;
    piVar5[-1] = 0;
    test_multi_readers();
  }
  puVar6 = (undefined1 *)piVar5;
  *(undefined8 *)(puVar6 + -8) = 0x105cb1;
  test_multi_readers();
LAB_00105cb1:
  *(undefined8 *)(puVar6 + -8) = 0x105cb6;
  test_multi_readers();
  if (auStack_68 != (undefined1  [8])0x0) {
    *(undefined8 *)(puVar6 + -8) = 0x105ccf;
    operator_delete((void *)auStack_68);
  }
  *(code **)(puVar6 + -8) = test_writer_multi_readers;
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static void test_multi_readers(multi_reader_type reader_type,
                               const char *test_name) {
    TEST_INIT();
    memleak_start();

    int r;
    int num_docs = 100000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    size_t n_readers = num_readers;

    // remove previous extended_test files
    r = system(SHELL_DEL" test.fdb* > errorlog.txt");
    (void)r;

    fdb_config fconfig = getDefaultConfig();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, test_filename, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "multi_reader_thread");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create a vector of docs on the heap
    std::vector<fdb_doc *> docs(num_docs, nullptr);

    // Load the initial documents with random keys.
    loadDocsWithRandomKeys(dbfile, db, &docs, num_docs);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // create reader threads.
    thread_t *tid = alca(thread_t, n_readers);
    void **thread_ret = alca(void *, n_readers);
    struct reader_thread_args *args = alca(struct reader_thread_args, n_readers);
    for (size_t i = 0; i < n_readers; ++i){
        args[i].tid = i;
        args[i].ndocs = num_docs;
        args[i].docs = &docs;
        args[i].config = &fconfig;
        args[i].kvs_config = &kvs_config;
        args[i].check_body = 1;
        if (reader_type == MULTI_READERS) {
            thread_create(&tid[i], _reader_thread, &args[i]);
        } else if (reader_type == MULTI_SNAPSHOT_READERS) {
            thread_create(&tid[i], _snapshot_reader_thread, &args[i]);
        } else { // mixed
            if (i % 2) {
                thread_create(&tid[i], _reader_thread, &args[i]);
            } else {
                thread_create(&tid[i], _snapshot_reader_thread, &args[i]);
            }
        }
    }

    // wait for thread termination
    for (size_t i = 0; i < n_readers; ++i){
        thread_join(tid[i], &thread_ret[i]);
    }

    // free all documents
    for (int i = 0 ; i < num_docs; ++i){
        fdb_doc_free(docs.at(i));
    }

    // shutdown
    fdb_shutdown();

    memleak_end();
    TEST_RESULT(test_name);
}